

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmapReader.h
# Opt level: O0

void __thiscall MmapReader::~MmapReader(MmapReader *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  MmapReader *this_local;
  
  (this->super_MemoryReader).super_ReadWriter._vptr_ReadWriter =
       (_func_int **)&PTR__MmapReader_0019b0d0;
  bVar1 = ReadWriter::isreadonly((ReadWriter *)this);
  if (!bVar1) {
    iVar2 = (*(this->super_MemoryReader).super_ReadWriter._vptr_ReadWriter[6])();
    file_helper::truncate(&this->_help,(char *)&this->_filename,CONCAT44(extraout_var,iVar2));
  }
  boost::interprocess::mapped_region::~mapped_region(&this->_region);
  boost::interprocess::file_mapping::~file_mapping(&this->_file);
  file_helper::~file_helper(&this->_help);
  std::__cxx11::string::~string((string *)&this->_filename);
  MemoryReader::~MemoryReader(&this->super_MemoryReader);
  return;
}

Assistant:

virtual ~MmapReader()
    {
        if (!isreadonly())
            _help.truncate(_filename, size());
    }